

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O1

CURLcode Curl_sasl_parse_url_auth_option(SASL *sasl,char *value,size_t len)

{
  unsigned_short uVar1;
  int iVar2;
  size_t in_RAX;
  CURLcode CVar3;
  size_t mechlen;
  size_t local_28;
  
  CVar3 = CURLE_URL_MALFORMAT;
  if (len != 0) {
    if ((sasl->field_0x1e & 1) != 0) {
      sasl->field_0x1e = sasl->field_0x1e & 0xfe;
      sasl->prefmech = 0;
    }
    local_28 = in_RAX;
    iVar2 = strncmp(value,"*",len);
    if (iVar2 == 0) {
      sasl->prefmech = 0xffdf;
    }
    else {
      uVar1 = Curl_sasl_decode_mech(value,len,&local_28);
      if (uVar1 == 0) {
        return CURLE_URL_MALFORMAT;
      }
      if (local_28 != len) {
        return CURLE_URL_MALFORMAT;
      }
      sasl->prefmech = sasl->prefmech | uVar1;
    }
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_sasl_parse_url_auth_option(struct SASL *sasl,
                                         const char *value, size_t len)
{
  CURLcode result = CURLE_OK;
  size_t mechlen;

  if(!len)
    return CURLE_URL_MALFORMAT;

  if(sasl->resetprefs) {
    sasl->resetprefs = FALSE;
    sasl->prefmech = SASL_AUTH_NONE;
  }

  if(!strncmp(value, "*", len))
    sasl->prefmech = SASL_AUTH_DEFAULT;
  else {
    unsigned short mechbit = Curl_sasl_decode_mech(value, len, &mechlen);
    if(mechbit && mechlen == len)
      sasl->prefmech |= mechbit;
    else
      result = CURLE_URL_MALFORMAT;
  }

  return result;
}